

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler_unittest.cc
# Opt level: O3

void * DieInThread(void *param_1)

{
  FILE *__stream;
  pthread_t pVar1;
  int b;
  int a;
  
  __stream = _stderr;
  pVar1 = pthread_self();
  fprintf(__stream,"0x%lx is dying\n",pVar1);
  fprintf(_stderr,"We should have died: b=%d\n",0);
  return (void *)0x0;
}

Assistant:

static void* DieInThread(void*) {
  // We assume pthread_t is an integral number or a pointer, rather
  // than a complex struct.  In some environments, pthread_self()
  // returns an uint64 but in some other environments pthread_self()
  // returns a pointer.  Hence we use C-style cast here, rather than
  // reinterpret/static_cast, to support both types of environments.
  fprintf(stderr, "0x%lx is dying\n", (long)pthread_self());
  // Use volatile to prevent from these to be optimized away.
  volatile int a = 0;
  volatile int b = 1 / a;
  fprintf(stderr, "We should have died: b=%d\n", b);
  return NULL;
}